

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_exporter.cpp
# Opt level: O0

void do_export_cl_csv_pdb(Params *params)

{
  bool bVar1;
  byte bVar2;
  char *__name;
  DIR *__dirp;
  dirent *pdVar3;
  reference conf;
  size_type sVar4;
  size_type sVar5;
  ostream *poVar6;
  reference pbVar7;
  int local_33c;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_330;
  const_iterator ils;
  ofstream fls;
  int local_124;
  vector<int,_std::allocator<int>_> local_120;
  vector<Point,_std::allocator<Point>_> local_108;
  allocator local_e1;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [8];
  string pdb_path;
  dirent *ent;
  DIR *dir;
  string *in_dir_path;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator idir;
  int num_confs;
  int MAX_CONFS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  confs_ls;
  vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  confs;
  Params *params_local;
  
  std::
  vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ::vector((vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
            *)&confs_ls.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&num_confs);
  if (params->export_cl_csv_pdb_max < 1) {
    local_33c = 0x7fffffff;
  }
  else {
    local_33c = params->export_cl_csv_pdb_max;
  }
  idir._M_current._4_4_ = local_33c;
  idir._M_current._0_4_ = 0;
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::cbegin(&params->export_cl_csv_pdb_in_dirs);
  do {
    in_dir_path = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::cend(&params->export_cl_csv_pdb_in_dirs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&in_dir_path);
    if (!bVar1) {
      sVar4 = std::
              vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
              ::size((vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                      *)&confs_ls.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&num_confs);
      if (sVar4 != sVar5) {
        __assert_fail("confs.size() == confs_ls.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                      ,0x111,"void do_export_cl_csv_pdb(const Params &)");
      }
      bVar1 = anon_unknown.dwarf_de9f::write_pdbs_to_csv
                        ((vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                          *)&confs_ls.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         &params->export_cl_csv_pdb_out_path);
      if (bVar1) {
        std::ofstream::ofstream(&ils,(string *)&params->export_cl_csv_pdb_out_ls_path,_S_out);
        bVar2 = std::ios::good();
        if ((bVar2 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "Error: failed to write cluster file list at: ");
          poVar6 = std::operator<<(poVar6,(string *)&params->export_cl_csv_pdb_out_ls_path);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          local_330._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&num_confs);
          while( true ) {
            local_338._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&num_confs);
            bVar1 = __gnu_cxx::operator!=(&local_330,&local_338);
            if (!bVar1) break;
            pbVar7 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_330);
            poVar6 = std::operator<<((ostream *)&ils,(string *)pbVar7);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_330);
          }
          std::ofstream::close();
          std::operator<<((ostream *)&std::cout,
                          "Full PDB to cluster CSV export finished successfully.\n");
        }
        std::ofstream::~ofstream(&ils);
      }
LAB_001533d9:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&num_confs);
      std::
      vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
      ::~vector((vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                 *)&confs_ls.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_50);
    poVar6 = std::operator<<((ostream *)&std::cout,"Loading PDBs from: ");
    poVar6 = std::operator<<(poVar6,(string *)pbVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    __name = (char *)std::__cxx11::string::c_str();
    __dirp = opendir(__name);
    if (__dirp == (DIR *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Error: could not open PDB directory: ");
      std::operator<<(poVar6,(string *)pbVar7);
      goto LAB_001533d9;
    }
    do {
      do {
        pdVar3 = readdir(__dirp);
        if (pdVar3 == (dirent *)0x0) goto LAB_0015317d;
        bVar1 = anon_unknown.dwarf_de9f::is_pdb_fname(pdVar3->d_name);
      } while (!bVar1);
      std::operator+(local_c0,(char *)pbVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,pdVar3->d_name,&local_e1);
      std::operator+(local_a0,local_c0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string((string *)local_c0);
      local_108.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_108.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_108.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<Point,_std::allocator<Point>_>::vector(&local_108);
      std::
      vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
      ::push_back((vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                   *)&confs_ls.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_108);
      std::vector<Point,_std::allocator<Point>_>::~vector(&local_108);
      conf = std::
             vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
             ::back((vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                     *)&confs_ls.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector(&local_120,&params->ends);
      bVar1 = anon_unknown.dwarf_de9f::load_conf
                        (conf,local_a0,&params->starts,&local_120,
                         (bool)(params->export_cl_csv_pdb_bbone_only & 1));
      std::vector<int,_std::allocator<int>_>::~vector(&local_120);
      if (bVar1) {
        idir._M_current._0_4_ = (int)idir._M_current + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&num_confs,local_a0);
        if ((int)idir._M_current == idir._M_current._4_4_) {
          std::operator<<((ostream *)&std::cout,
                          "Warning: Maximum number of conformations reached.\n");
          local_124 = 6;
        }
        else {
          if ((int)idir._M_current % 500 == 0) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Processed file #");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)idir._M_current);
            poVar6 = std::operator<<(poVar6,": ");
            poVar6 = std::operator<<(poVar6,(string *)local_a0);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          local_124 = 0;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,"Error: unable to load ");
        poVar6 = std::operator<<(poVar6,(string *)local_a0);
        std::operator<<(poVar6,"std::endl");
        closedir(__dirp);
        local_124 = 1;
      }
      std::__cxx11::string::~string((string *)local_a0);
    } while (local_124 == 0);
    if (local_124 != 6) goto LAB_001533d9;
LAB_0015317d:
    closedir(__dirp);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

void do_export_cl_csv_pdb(const Params &params) {

    // Store loop regions as point arrays
    std::vector<SlimStruct> confs;

    // File path to each PDB used for clustering
    std::vector<std::string> confs_ls;

    // Determine maximum number of PDBs to load
    const int MAX_CONFS = (params.export_cl_csv_pdb_max > 0)
        ? params.export_cl_csv_pdb_max : INT_MAX;

    // Load loops
    int num_confs = 0;
    for (auto idir = params.export_cl_csv_pdb_in_dirs.cbegin();
         idir != params.export_cl_csv_pdb_in_dirs.cend(); ++idir) {

        const std::string &in_dir_path = *idir;
        std::cout << "Loading PDBs from: " << in_dir_path << std::endl;

        DIR *dir;
        struct dirent *ent;
        if ((dir = opendir(in_dir_path.c_str())) != NULL) {
            // Process all PDB files in this directory
            while ((ent = readdir(dir)) != NULL) {
                
                // Skip files without .pdb extension
                if (!is_pdb_fname(ent->d_name)) {
                    continue;
                }

                // Assume input directory does end in path separator.
                // Determine path to this PDB file
                const std::string pdb_path = in_dir_path + "/" + std::string(ent->d_name);

                // Load 
                confs.push_back(SlimStruct());
                if (load_conf(
                          confs.back()
                        , pdb_path
                        , params.starts
                        , params.ends
                        , params.export_cl_csv_pdb_bbone_only)) {
                    ++num_confs;
                    confs_ls.push_back(pdb_path);
                }
                else {
                    std::cout << "Error: unable to load " << pdb_path << "std::endl";
                    closedir(dir);
                    return;
                }

                if (num_confs == MAX_CONFS) {
                    std::cout << "Warning: Maximum number of conformations reached.\n";
                    break;
                }

                // Heartbeat
                if ((num_confs % DISGRO_SMC_REPORT_INTERVAL) == 0) {
                    std::cout << "Processed file #" << num_confs << ": " << pdb_path << std::endl;
                }
            }
            closedir(dir);
        }
        else {
            std::cout << "Error: could not open PDB directory: " << in_dir_path;
            return;
        }

    } // End iteration over PDB  input directories

    assert(confs.size() == confs_ls.size());

    if (!write_pdbs_to_csv(confs, params.export_cl_csv_pdb_out_path)) {
        // Export failed"
        return;
    }

    // write ls file
    std::ofstream fls(params.export_cl_csv_pdb_out_ls_path);
    if (!fls.good()) {
        std::cout << "Error: failed to write cluster file list at: "
                  << params.export_cl_csv_pdb_out_ls_path << std::endl;
        return;
    }
    for (auto ils = confs_ls.cbegin(); ils != confs_ls.cend(); ++ils) {
        fls << *ils << std::endl;
    }
    fls.close();

    std::cout << "Full PDB to cluster CSV export finished successfully.\n";
}